

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_base.h
# Opt level: O3

string * __thiscall
bandit::reporter::progress_base::current_context_name_abi_cxx11_
          (string *__return_storage_ptr__,progress_base *this)

{
  _List_node_base *p_Var1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var1 = (_List_node_base *)&this->contexts_;
  while (p_Var1 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->contexts_) {
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var1[1]._M_next);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string current_context_name() {
        std::string name;

        for (const auto& context : contexts_) {
          if (name.size() > 0) {
            name += " ";
          }

          name += context;
        }

        return name;
      }